

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_lifetime.h
# Opt level: O3

void __thiscall
validation_layer::HandleLifetimeValidation::addHandle<_ze_rtas_builder_ext_handle_t*>
          (HandleLifetimeValidation *this,_ze_rtas_builder_ext_handle_t *handle)

{
  _ze_rtas_builder_ext_handle_t *local_18;
  void *local_10;
  
  this->untrackedHandles = this->untrackedHandles + 1;
  local_10 = (void *)0x0;
  local_18 = handle;
  std::
  _Hashtable<void*,std::pair<void*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>,std::allocator<std::pair<void*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<void*const,std::unique_ptr<validation_layer::_zel_handle_state_t,std::default_delete<validation_layer::_zel_handle_state_t>>>>
            (&this->defaultHandleStateMap,&local_18);
  if (local_10 != (void *)0x0) {
    operator_delete(local_10,1);
  }
  return;
}

Assistant:

void addHandle(T handle) {
    // TODO : Log warning
    untrackedHandles++;
    defaultHandleStateMap.insert({static_cast<void *>(handle), nullptr});
  }